

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_rfn_apply_ext(lys_module *module)

{
  int iVar1;
  lys_refine *rfn_00;
  ly_set *set;
  lys_ext_instance **pplVar2;
  lys_node *plVar3;
  lys_node *plVar4;
  ly_set *extset;
  lys_refine *rfn;
  lys_node_uses *uses;
  lys_node *target;
  lys_node *node;
  lys_node *next;
  lys_node *nextroot;
  lys_node *root;
  uint local_20;
  int a;
  int k;
  int i;
  lys_module *module_local;
  
  root._4_4_ = 0;
  nextroot = module->data;
  _k = module;
  do {
    if (nextroot == (lys_node *)0x0) {
      return 0;
    }
    next = nextroot->next;
    node = nextroot;
LAB_001392ce:
    plVar3 = node;
    if (node != (lys_node *)0x0) {
      target = node;
      if (node->nodetype == LYS_USES) {
        for (a = 0; a < (int)(uint)plVar3->padding[2]; a = a + 1) {
          if (plVar3[1].name[(long)a * 0x50 + 0x1a] != '\0') {
            rfn_00 = (lys_refine *)(plVar3[1].name + (long)a * 0x50);
            uses = (lys_node_uses *)0x0;
            resolve_descendant_schema_nodeid
                      (rfn_00->target_name,plVar3->child,0xc0ff,0,(lys_node **)&uses);
            if (uses == (lys_node_uses *)0x0) {
              ly_log(_k->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                     ,0xc45);
              return 1;
            }
            set = ly_set_new();
            local_20 = -1;
            while (local_20 = lys_ext_iter(rfn_00->ext,rfn_00->ext_size,(char)local_20 + '\x01',
                                           LYEXT_SUBSTMT_SELF), local_20 != -1) {
              ly_set_add(set,rfn_00->ext[(int)local_20]->def,0);
            }
            for (local_20 = 0; local_20 < set->number; local_20 = local_20 + 1) {
              iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_SELF,
                                         (lys_ext *)(set->set).s[(int)local_20]);
              if (iVar1 != 0) {
                ly_set_free(set);
                return 1;
              }
            }
            ly_set_free(set);
            if ((rfn_00->dsc != (char *)0x0) &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_DESCRIPTION,
                                           (lys_ext *)0x0), iVar1 != 0)) {
              return 1;
            }
            if ((rfn_00->ref != (char *)0x0) &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_REFERENCE,
                                           (lys_ext *)0x0), iVar1 != 0)) {
              return 1;
            }
            if ((((rfn_00->flags & 3) != 0) && ((uses->flags & 3) != 0)) &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_CONFIG,
                                           (lys_ext *)0x0), iVar1 != 0)) {
              return 1;
            }
            if ((rfn_00->dflt_size != '\0') &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_DEFAULT,
                                           (lys_ext *)0x0), iVar1 != 0)) {
              return 1;
            }
            if (((rfn_00->flags & 0xc0) != 0) &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_MANDATORY,
                                           (lys_ext *)0x0), iVar1 != 0)) {
              return 1;
            }
            if ((((uses->nodetype & LYS_CONTAINER) != LYS_UNKNOWN) &&
                ((rfn_00->mod).presence != (char *)0x0)) &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_PRESENCE,
                                           (lys_ext *)0x0), iVar1 != 0)) {
              return 1;
            }
            if (((rfn_00->flags & 0x10) != 0) &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_MIN,(lys_ext *)0x0)
               , iVar1 != 0)) {
              return 1;
            }
            if (((rfn_00->flags & 8) != 0) &&
               (iVar1 = lyp_rfn_apply_ext_(rfn_00,(lys_node *)uses,LYEXT_SUBSTMT_MAX,(lys_ext *)0x0)
               , iVar1 != 0)) {
              return 1;
            }
            if (uses->ext_size != '\0') {
              pplVar2 = (lys_ext_instance **)realloc(uses->ext,(ulong)uses->ext_size << 3);
              uses->ext = pplVar2;
            }
          }
        }
      }
      if ((target->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        node = target->child;
      }
      else {
        node = (lys_node *)0x0;
      }
      if (node == (lys_node *)0x0) {
        if (target == nextroot) goto LAB_0013973e;
        node = target->next;
      }
      while (node == (lys_node *)0x0) {
        if (target->parent->nodetype == LYS_AUGMENT) {
          target = target->parent->prev;
        }
        else {
          target = target->parent;
        }
        plVar3 = lys_parent(target);
        plVar4 = lys_parent(nextroot);
        if (plVar3 == plVar4) break;
        node = target->next;
      }
      goto LAB_001392ce;
    }
LAB_0013973e:
    if ((next == (lys_node *)0x0) && (root._4_4_ < (int)(uint)_k->augment_size)) {
      next = _k->augment[root._4_4_].child;
      root._4_4_ = root._4_4_ + 1;
    }
    nextroot = next;
  } while( true );
}

Assistant:

int
lyp_rfn_apply_ext(struct lys_module *module)
{
    int i, k, a = 0;
    struct lys_node *root, *nextroot, *next, *node;
    struct lys_node *target;
    struct lys_node_uses *uses;
    struct lys_refine *rfn;
    struct ly_set *extset;

    /* refines in uses */
    LY_TREE_FOR_SAFE(module->data, nextroot, root) {
        /* go through the data tree of the module and all the defined augments */

        LY_TREE_DFS_BEGIN(root, next, node) {
            if (node->nodetype == LYS_USES) {
                uses = (struct lys_node_uses *)node;

                for (i = 0; i < uses->refine_size; i++) {
                    if (!uses->refine[i].ext_size) {
                        /* no extensions in refine */
                        continue;
                    }
                    rfn = &uses->refine[i]; /* shortcut */

                    /* get the target node */
                    target = NULL;
                    resolve_descendant_schema_nodeid(rfn->target_name, uses->child,
                                                     LYS_NO_RPC_NOTIF_NODE | LYS_ACTION | LYS_NOTIF,
                                                     0, (const struct lys_node **)&target);
                    if (!target) {
                        /* it should always succeed since the target_name was already resolved at least
                         * once when the refine itself was being resolved */
                        LOGINT(module->ctx);;
                        return EXIT_FAILURE;
                    }

                    /* extensions */
                    extset = ly_set_new();
                    k = -1;
                    while ((k = lys_ext_iter(rfn->ext, rfn->ext_size, k + 1, LYEXT_SUBSTMT_SELF)) != -1) {
                        ly_set_add(extset, rfn->ext[k]->def, 0);
                    }
                    for (k = 0; (unsigned int)k < extset->number; k++) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_SELF, (struct lys_ext *)extset->set.g[k])) {
                            ly_set_free(extset);
                            return EXIT_FAILURE;
                        }
                    }
                    ly_set_free(extset);

                    /* description */
                    if (rfn->dsc && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_DESCRIPTION, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* reference */
                    if (rfn->ref && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_REFERENCE, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* config, in case of notification or rpc/action{notif, the config is not applicable
                     * (there is no config status) */
                    if ((rfn->flags & LYS_CONFIG_MASK) && (target->flags & LYS_CONFIG_MASK)) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_CONFIG, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* default value */
                    if (rfn->dflt_size && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_DEFAULT, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* mandatory */
                    if (rfn->flags & LYS_MAND_MASK) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MANDATORY, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* presence */
                    if ((target->nodetype & LYS_CONTAINER) && rfn->mod.presence) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_PRESENCE, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* min/max */
                    if (rfn->flags & LYS_RFN_MINSET) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MIN, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    if (rfn->flags & LYS_RFN_MAXSET) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MAX, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* must and if-feature contain extensions on their own, not needed to be solved here */

                    if (target->ext_size) {
                        /* the allocated target's extension array can be now longer than needed in case
                         * there is less refine substatement's extensions than in original. Since we are
                         * going to reduce or keep the same memory, it is not necessary to test realloc's result */
                        target->ext = realloc(target->ext, target->ext_size * sizeof *target->ext);
                    }
                }
            }
            LY_TREE_DFS_END(root, next, node)
        }

        if (!nextroot && a < module->augment_size) {
            nextroot = module->augment[a].child;
            a++;
        }
    }

    return EXIT_SUCCESS;
}